

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  __m256i alVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [32];
  uint uVar8;
  bool bVar9;
  __m256i *palVar10;
  __m256i c;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar14;
  __m256i *b_00;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  __m256i *ptr;
  ulong uVar18;
  int iVar19;
  long lVar20;
  ulong size;
  long lVar21;
  __m256i *palVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [32];
  int32_t column_len;
  undefined1 in_stack_fffffffffffffeb8 [12];
  undefined4 in_stack_fffffffffffffec4;
  int iVar29;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 uVar30;
  int iVar31;
  undefined4 uVar32;
  __m256i *local_108;
  undefined1 auVar25 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_table_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sw_table_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_avx2_256_32_cold_4();
        }
        else {
          uVar16 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_avx2_256_32_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_avx2_256_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_avx2_256_32_cold_1();
          }
          else {
            uVar1 = (ulong)uVar3 + 7;
            iVar13 = ppVar5->max;
            result = parasail_result_new_table1((uint)uVar1 & 0x7ffffff8,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 3;
              result->flag = result->flag | 0x8420804;
              b = parasail_memalign___m256i(0x20,size);
              palVar14 = parasail_memalign___m256i(0x20,size);
              local_108 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              uVar30 = SUB84(palVar14,0);
              uVar32 = (undefined4)((ulong)palVar14 >> 0x20);
              if ((b_00 != (__m256i *)0x0 && local_108 != (__m256i *)0x0) &&
                  (palVar14 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
                alVar2[1]._4_4_ = in_stack_fffffffffffffec4;
                alVar2._0_12_ = in_stack_fffffffffffffeb8;
                alVar2[2] = in_stack_fffffffffffffec8;
                alVar2[3]._0_4_ = uVar30;
                alVar2[3]._4_4_ = uVar32;
                parasail_memset___m256i(b,alVar2,size);
                c[1]._4_4_ = in_stack_fffffffffffffec4;
                c._0_12_ = in_stack_fffffffffffffeb8;
                c[2] = in_stack_fffffffffffffec8;
                c[3]._0_4_ = uVar30;
                c[3]._4_4_ = uVar32;
                parasail_memset___m256i(b_00,c,size);
                auVar11._4_4_ = gap;
                auVar11._0_4_ = gap;
                auVar11._8_4_ = gap;
                auVar11._12_4_ = gap;
                auVar11._16_4_ = gap;
                auVar11._20_4_ = gap;
                auVar11._24_4_ = gap;
                auVar11._28_4_ = gap;
                auVar12._4_4_ = open;
                auVar12._0_4_ = open;
                auVar12._8_4_ = open;
                auVar12._12_4_ = open;
                auVar12._16_4_ = open;
                auVar12._20_4_ = open;
                auVar12._24_4_ = open;
                auVar12._28_4_ = open;
                uVar8 = (uint)size;
                lVar17 = size * uVar16;
                iVar29 = -0x40000000;
                auVar24._8_4_ = 0xc0000000;
                auVar24._0_8_ = 0xc0000000c0000000;
                auVar24._12_4_ = 0xc0000000;
                auVar24._16_4_ = 0xc0000000;
                auVar24._20_4_ = 0xc0000000;
                auVar24._24_4_ = 0xc0000000;
                auVar24._28_4_ = 0xc0000000;
                auVar25 = ZEXT3264(auVar24);
                lVar20 = 0;
                uVar15 = 0;
                auVar26 = ZEXT3264(auVar24);
                uVar18 = 0;
                palVar14 = (__m256i *)CONCAT44(uVar32,uVar30);
                do {
                  ptr = b;
                  iVar31 = ppVar5->mapper[(byte)s2[uVar15]];
                  palVar22 = local_108;
                  b = palVar14;
                  if ((int)uVar18 == (int)uVar15 + -2) {
                    palVar22 = palVar14;
                    b = local_108;
                  }
                  alVar2 = ptr[uVar8 - 1];
                  auVar24 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  auVar24 = vpalignr_avx2((undefined1  [32])alVar2,auVar24,0xc);
                  lVar23 = 0;
                  auVar27 = ZEXT1664((undefined1  [16])0x0);
                  lVar21 = lVar20;
                  do {
                    auVar28 = vpaddd_avx2(auVar24,*(undefined1 (*) [32])
                                                   ((long)pvVar4 +
                                                   lVar23 + size * (long)iVar31 * 0x20));
                    auVar24 = *(undefined1 (*) [32])((long)*b_00 + lVar23);
                    auVar7 = vpmaxsd_avx2(auVar24,auVar27._0_32_);
                    auVar28 = vpmaxsd_avx2(auVar28,auVar7);
                    auVar28 = vpmaxsd_avx2(auVar28,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    *(undefined1 (*) [32])((long)*b + lVar23) = auVar28;
                    piVar6 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + lVar21) = auVar28._0_4_;
                    *(int *)((long)piVar6 + lVar17 * 4 + lVar21) = auVar28._4_4_;
                    *(int *)((long)piVar6 + lVar17 * 8 + lVar21) = auVar28._8_4_;
                    *(int *)((long)piVar6 + lVar17 * 0xc + lVar21) = auVar28._12_4_;
                    *(int *)((long)piVar6 + lVar17 * 0x10 + lVar21) = auVar28._16_4_;
                    *(int *)((long)piVar6 + lVar17 * 0x14 + lVar21) = auVar28._20_4_;
                    *(int *)((long)piVar6 + lVar17 * 0x18 + lVar21) = auVar28._24_4_;
                    *(int *)((long)piVar6 + lVar17 * 0x1c + lVar21) = auVar28._28_4_;
                    auVar7 = vpmaxsd_avx2(auVar28,auVar26._0_32_);
                    auVar26 = ZEXT3264(auVar7);
                    auVar28 = vpsubd_avx2(auVar28,auVar12);
                    auVar24 = vpsubd_avx2(auVar24,auVar11);
                    auVar24 = vpmaxsd_avx2(auVar24,auVar28);
                    *(undefined1 (*) [32])((long)*b_00 + lVar23) = auVar24;
                    auVar24 = vpsubd_avx2(auVar27._0_32_,auVar11);
                    auVar24 = vpmaxsd_avx2(auVar24,auVar28);
                    auVar27 = ZEXT3264(auVar24);
                    auVar24 = *(undefined1 (*) [32])((long)*ptr + lVar23);
                    lVar23 = lVar23 + 0x20;
                    lVar21 = lVar21 + uVar16 * 4;
                  } while (size << 5 != lVar23);
                  iVar31 = 0;
                  do {
                    auVar28 = auVar27._0_32_;
                    auVar24 = vperm2i128_avx2(auVar28,auVar28,8);
                    auVar24 = vpalignr_avx2(auVar28,auVar24,0xc);
                    auVar27 = ZEXT3264(auVar24);
                    lVar23 = 0;
                    lVar21 = lVar20;
                    do {
                      auVar24 = vpmaxsd_avx2(auVar27._0_32_,
                                             *(undefined1 (*) [32])((long)*b + lVar23));
                      *(undefined1 (*) [32])((long)*b + lVar23) = auVar24;
                      piVar6 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar6 + lVar21) = auVar24._0_4_;
                      *(int *)((long)piVar6 + lVar17 * 4 + lVar21) = auVar24._4_4_;
                      *(int *)((long)piVar6 + lVar17 * 8 + lVar21) = auVar24._8_4_;
                      *(int *)((long)piVar6 + lVar17 * 0xc + lVar21) = auVar24._12_4_;
                      *(int *)((long)piVar6 + lVar17 * 0x10 + lVar21) = auVar24._16_4_;
                      *(int *)((long)piVar6 + lVar17 * 0x14 + lVar21) = auVar24._20_4_;
                      *(int *)((long)piVar6 + lVar17 * 0x18 + lVar21) = auVar24._24_4_;
                      *(int *)((long)piVar6 + lVar17 * 0x1c + lVar21) = auVar24._28_4_;
                      auVar28 = vpmaxsd_avx2(auVar24,auVar26._0_32_);
                      auVar26 = ZEXT3264(auVar28);
                      auVar24 = vpsubd_avx2(auVar24,auVar12);
                      auVar7 = vpsubd_avx2(auVar27._0_32_,auVar11);
                      auVar27 = ZEXT3264(auVar7);
                      auVar24 = vpcmpgtd_avx2(auVar7,auVar24);
                      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar24 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar24 >> 0x7f,0) == '\0') &&
                            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar24 >> 0xbf,0) == '\0') &&
                          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar24[0x1f]) goto LAB_007971c6;
                      lVar23 = lVar23 + 0x20;
                      lVar21 = lVar21 + uVar16 * 4;
                    } while (size << 5 != lVar23);
                    iVar31 = iVar31 + 1;
                  } while (iVar31 != 8);
LAB_007971c6:
                  auVar24 = vpcmpgtd_avx2(auVar28,auVar25._0_32_);
                  bVar9 = true;
                  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar24 >> 0x7f,0) != '\0') ||
                        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0xbf,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar24[0x1f] < '\0') {
                    auVar24 = vpermq_avx2(auVar28,0x44);
                    auVar24 = vpmaxsd_avx2(auVar28,auVar24);
                    auVar28 = vpslldq_avx2(auVar24,8);
                    auVar24 = vpmaxsd_avx2(auVar24,auVar28);
                    auVar28 = vpslldq_avx2(auVar24,4);
                    auVar24 = vpmaxsd_avx2(auVar24,auVar28);
                    iVar29 = auVar24._28_4_;
                    if (0x7ffffffe - iVar13 < iVar29) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      bVar9 = false;
                    }
                    else {
                      auVar28._8_4_ = 7;
                      auVar28._0_8_ = 0x700000007;
                      auVar28._12_4_ = 7;
                      auVar28._16_4_ = 7;
                      auVar28._20_4_ = 7;
                      auVar28._24_4_ = 7;
                      auVar28._28_4_ = 7;
                      auVar24 = vpermd_avx2(auVar28,auVar24);
                      auVar25 = ZEXT3264(auVar24);
                      uVar18 = uVar15 & 0xffffffff;
                    }
                  }
                  iVar19 = (int)uVar18;
                  iVar31 = (int)uVar15;
                  if (!bVar9) break;
                  uVar15 = uVar15 + 1;
                  lVar20 = lVar20 + 4;
                  palVar14 = ptr;
                  iVar31 = s2Len;
                  local_108 = palVar22;
                } while (uVar15 != uVar16);
                if (iVar29 == 0x7fffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar13 = parasail_result_is_saturated(result);
                palVar14 = palVar22;
                if (iVar13 == 0) {
                  palVar10 = ptr;
                  if (iVar19 == iVar31 + -2) {
                    palVar14 = ptr;
                    palVar10 = palVar22;
                  }
                  if (iVar19 == iVar31 + -1) {
                    palVar14 = b;
                    b = palVar22;
                    palVar10 = ptr;
                  }
                  ptr = palVar10;
                  iVar13 = uVar3 - 1;
                  if ((uVar1 & 0x7ffffff8) != 0) {
                    uVar16 = 0;
                    do {
                      if ((*(int *)((long)*palVar14 + uVar16 * 4) == iVar29) &&
                         (iVar31 = ((uint)uVar16 & 7) * uVar8 + ((uint)(uVar16 >> 3) & 0x1fffffff),
                         iVar31 < iVar13)) {
                        iVar13 = iVar31;
                      }
                      uVar16 = uVar16 + 1;
                    } while ((uVar8 & 0xfffffff) << 3 != (int)uVar16);
                  }
                }
                else {
                  iVar19 = 0;
                  iVar29 = 0x7fffffff;
                  iVar13 = 0;
                }
                result->score = iVar29;
                result->end_query = iVar13;
                result->end_ref = iVar19;
                parasail_free(b_00);
                parasail_free(palVar14);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int32_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi32(vH, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi32(vH, vGapO);
            vE = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vH = _mm256_sub_epi32(vH, vGapO);
                vF = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm256_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}